

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wedge_utils_avx2.c
# Opt level: O0

uint64_t av1_wedge_sse_from_residuals_avx2(int16_t *r1,int16_t *d,uint8_t *m,int N)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined1 auVar9 [32];
  __m128i v_acc_q_1;
  __m128i v_acc_q_0;
  __m256i v_sum0_q;
  __m256i v_sq0_d;
  __m256i v_t0_w;
  __m256i v_t0h_d;
  __m256i v_t0l_d;
  __m256i v_m0h_w;
  __m256i v_m0l_w;
  __m256i v_m0_w;
  __m256i v_rd0h_w;
  __m256i v_rd0l_w;
  __m128i v_m01_b;
  __m256i v_d0_w;
  __m256i v_r0_w;
  __m256i v_acc0_q;
  __m256i v_zext_q;
  __m256i v_mask_max_w;
  uint64_t csse;
  int n;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined1 local_540 [112];
  undefined4 local_4d0;
  undefined8 uStack_498;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  local_4d0 = -in_ECX;
  auVar2 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar2 = vpinsrw_avx(auVar2,0x40,2);
  auVar2 = vpinsrw_avx(auVar2,0x40,3);
  auVar2 = vpinsrw_avx(auVar2,0x40,4);
  auVar2 = vpinsrw_avx(auVar2,0x40,5);
  auVar2 = vpinsrw_avx(auVar2,0x40,6);
  auVar2 = vpinsrw_avx(auVar2,0x40,7);
  auVar3 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar3 = vpinsrw_avx(auVar3,0x40,2);
  auVar3 = vpinsrw_avx(auVar3,0x40,3);
  auVar3 = vpinsrw_avx(auVar3,0x40,4);
  auVar3 = vpinsrw_avx(auVar3,0x40,5);
  auVar3 = vpinsrw_avx(auVar3,0x40,6);
  auVar3 = vpinsrw_avx(auVar3,0x40,7);
  uStack_b0 = auVar3._0_8_;
  uStack_a8 = auVar3._8_8_;
  auVar3 = vpunpcklqdq_avx(ZEXT816(0xffffffff),ZEXT816(0xffffffff));
  auVar4 = vpunpcklqdq_avx(ZEXT816(0xffffffff),ZEXT816(0xffffffff));
  uStack_70 = auVar4._0_8_;
  uStack_68 = auVar4._8_8_;
  uStack_498 = SUB328(ZEXT832(0),4);
  local_540._0_32_ = ZEXT832(uStack_498) << 0x40;
  do {
    auVar9 = vlddqu_avx(*(undefined1 (*) [32])(in_RDI + (long)in_ECX * 2 + (long)local_4d0 * 2));
    auVar1 = vlddqu_avx(*(undefined1 (*) [32])(in_RSI + (long)in_ECX * 2 + (long)local_4d0 * 2));
    auVar4 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + in_ECX + (long)local_4d0));
    auVar6 = vpunpcklwd_avx2(auVar1,auVar9);
    auVar1 = vpunpckhwd_avx2(auVar1,auVar9);
    auVar9 = vpmovzxbw_avx2(auVar4);
    auVar5._16_8_ = uStack_b0;
    auVar5._0_16_ = auVar2;
    auVar5._24_8_ = uStack_a8;
    auVar7 = vpunpcklwd_avx2(auVar9,auVar5);
    auVar8._16_8_ = uStack_b0;
    auVar8._0_16_ = auVar2;
    auVar8._24_8_ = uStack_a8;
    auVar5 = vpunpckhwd_avx2(auVar9,auVar8);
    auVar9 = vpmaddwd_avx2(auVar6,auVar7);
    auVar1 = vpmaddwd_avx2(auVar1,auVar5);
    auVar9 = vpackssdw_avx2(auVar9,auVar1);
    auVar1 = vpmaddwd_avx2(auVar9,auVar9);
    auVar9._16_8_ = uStack_70;
    auVar9._0_16_ = auVar3;
    auVar9._24_8_ = uStack_68;
    auVar9 = vpand_avx2(auVar1,auVar9);
    auVar1 = vpsrlq_avx2(auVar1,ZEXT416(0x20));
    auVar9 = vpaddq_avx2(auVar9,auVar1);
    local_540._0_32_ = vpaddq_avx2(local_540._0_32_,auVar9);
    local_4d0 = local_4d0 + 0x10;
  } while (local_4d0 != 0);
  auVar9 = vpsrldq_avx2(local_540._0_32_,8);
  auVar9 = vpaddq_avx2(local_540._0_32_,auVar9);
  local_540._16_16_ = auVar9._16_16_;
  auVar2._8_8_ = uStack_6f8;
  auVar2._0_8_ = local_700;
  auVar2 = vpaddq_avx(local_540._16_16_,auVar2);
  local_6f0 = auVar2._0_8_;
  return local_6f0 + 0x800U >> 0xc;
}

Assistant:

uint64_t av1_wedge_sse_from_residuals_avx2(const int16_t *r1, const int16_t *d,
                                           const uint8_t *m, int N) {
  int n = -N;

  uint64_t csse;

  const __m256i v_mask_max_w = _mm256_set1_epi16(MAX_MASK_VALUE);
  const __m256i v_zext_q = _mm256_set1_epi64x(~0u);

  __m256i v_acc0_q = _mm256_setzero_si256();

  assert(N % 64 == 0);

  r1 += N;
  d += N;
  m += N;

  do {
    const __m256i v_r0_w = _mm256_lddqu_si256((__m256i *)(r1 + n));
    const __m256i v_d0_w = _mm256_lddqu_si256((__m256i *)(d + n));
    const __m128i v_m01_b = _mm_lddqu_si128((__m128i *)(m + n));

    const __m256i v_rd0l_w = _mm256_unpacklo_epi16(v_d0_w, v_r0_w);
    const __m256i v_rd0h_w = _mm256_unpackhi_epi16(v_d0_w, v_r0_w);
    const __m256i v_m0_w = _mm256_cvtepu8_epi16(v_m01_b);

    const __m256i v_m0l_w = _mm256_unpacklo_epi16(v_m0_w, v_mask_max_w);
    const __m256i v_m0h_w = _mm256_unpackhi_epi16(v_m0_w, v_mask_max_w);

    const __m256i v_t0l_d = _mm256_madd_epi16(v_rd0l_w, v_m0l_w);
    const __m256i v_t0h_d = _mm256_madd_epi16(v_rd0h_w, v_m0h_w);

    const __m256i v_t0_w = _mm256_packs_epi32(v_t0l_d, v_t0h_d);

    const __m256i v_sq0_d = _mm256_madd_epi16(v_t0_w, v_t0_w);

    const __m256i v_sum0_q = _mm256_add_epi64(
        _mm256_and_si256(v_sq0_d, v_zext_q), _mm256_srli_epi64(v_sq0_d, 32));

    v_acc0_q = _mm256_add_epi64(v_acc0_q, v_sum0_q);

    n += 16;
  } while (n);

  v_acc0_q = _mm256_add_epi64(v_acc0_q, _mm256_srli_si256(v_acc0_q, 8));
  __m128i v_acc_q_0 = _mm256_castsi256_si128(v_acc0_q);
  __m128i v_acc_q_1 = _mm256_extracti128_si256(v_acc0_q, 1);
  v_acc_q_0 = _mm_add_epi64(v_acc_q_0, v_acc_q_1);
#if AOM_ARCH_X86_64
  csse = (uint64_t)_mm_extract_epi64(v_acc_q_0, 0);
#else
  xx_storel_64(&csse, v_acc_q_0);
#endif

  return ROUND_POWER_OF_TWO(csse, 2 * WEDGE_WEIGHT_BITS);
}